

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_list_free(ly_ctx *ctx,lys_node_list *list,
                  _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  int local_28;
  int local_24;
  int j;
  int i;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_list *list_local;
  ly_ctx *ctx_local;
  
  lys_when_free(ctx,list->when,private_destructor);
  for (local_24 = 0; local_24 < (int)(uint)list->must_size; local_24 = local_24 + 1) {
    lys_restr_free(ctx,list->must + local_24,private_destructor);
  }
  free(list->must);
  for (local_24 = 0; local_24 < (int)(uint)list->tpdf_size; local_24 = local_24 + 1) {
    lys_tpdf_free(ctx,list->tpdf + local_24,private_destructor);
  }
  free(list->tpdf);
  free(list->keys);
  for (local_24 = 0; local_24 < (int)(uint)list->unique_size; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < (int)(uint)list->unique[local_24].expr_size;
        local_28 = local_28 + 1) {
      lydict_remove(ctx,list->unique[local_24].expr[local_28]);
    }
    free(list->unique[local_24].expr);
  }
  free(list->unique);
  lydict_remove(ctx,list->keys_str);
  return;
}

Assistant:

static void
lys_list_free(struct ly_ctx *ctx, struct lys_node_list *list,
              void (*private_destructor)(const struct lys_node *node, void *priv))
{
    int i, j;

    /* handle only specific parts for LY_NODE_LIST */
    lys_when_free(ctx, list->when, private_destructor);

    for (i = 0; i < list->must_size; i++) {
        lys_restr_free(ctx, &list->must[i], private_destructor);
    }
    free(list->must);

    for (i = 0; i < list->tpdf_size; i++) {
        lys_tpdf_free(ctx, &list->tpdf[i], private_destructor);
    }
    free(list->tpdf);

    free(list->keys);

    for (i = 0; i < list->unique_size; i++) {
        for (j = 0; j < list->unique[i].expr_size; j++) {
            lydict_remove(ctx, list->unique[i].expr[j]);
        }
        free(list->unique[i].expr);
    }
    free(list->unique);

    lydict_remove(ctx, list->keys_str);
}